

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O3

void __thiscall QtMWidgets::PageView::removeWidget(PageView *this,QWidget *widget)

{
  PageViewPrivate *pPVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  pPVar1 = (this->d).d;
  lVar2 = (pPVar1->pages).d.size;
  if (0 < lVar2) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      if ((pPVar1->pages).d.ptr[lVar5] == widget) {
        QList<QWidget_*>::removeAt(&pPVar1->pages,lVar4 >> 0x20);
        QWidget::setParent(widget);
        QWidget::hide();
        iVar3 = PageControl::currentIndex(((this->d).d)->control);
        pPVar1 = (this->d).d;
        PageControl::setCount(pPVar1->control,(int)(pPVar1->pages).d.size);
        if (iVar3 != (int)lVar5) {
          return;
        }
        iVar3 = PageControl::currentIndex(((this->d).d)->control);
        if (iVar3 == -1) {
          return;
        }
        pPVar1 = (this->d).d;
        iVar3 = PageControl::currentIndex(pPVar1->control);
        PageViewPrivate::showPage(pPVar1,iVar3);
        return;
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x100000000;
    } while (lVar2 != lVar5);
  }
  return;
}

Assistant:

void
PageView::removeWidget( QWidget * widget )
{
	const int index  = indexOf( widget );

	if( index != -1 )
	{
		d->pages.removeAt( index );

		widget->setParent( 0 );

		widget->hide();

		const bool changePage = index == currentIndex();

		d->control->setCount( d->pages.count() );

		if( changePage && currentIndex() != -1 )
			d->showPage( currentIndex() );
	}
}